

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derTSEQDecStart(der_anchor_t *anchor,octet *der,size_t count,u32 tag)

{
  bool_t bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  bVar1 = derTIsConstructive(tag);
  sVar4 = 0xffffffffffffffff;
  if (bVar1 != 0) {
    anchor->der = der;
    sVar2 = derTDec(&anchor->tag,der,count);
    if ((sVar2 != 0xffffffffffffffff) && (anchor->tag == tag)) {
      sVar3 = derLDec(&anchor->len,der + sVar2,count - sVar2);
      sVar4 = sVar2 + sVar3;
      if (sVar3 == 0xffffffffffffffff) {
        sVar4 = 0xffffffffffffffff;
      }
    }
  }
  return sVar4;
}

Assistant:

size_t derTSEQDecStart(der_anchor_t* anchor, const octet der[], size_t count,
	u32 tag)
{
	size_t t_count;
	size_t l_count;
	// pre
	ASSERT(memIsValid(anchor, sizeof(der_anchor_t)));
	// проверить тег
	if (!derTIsConstructive(tag))
		return SIZE_MAX;
	// бросить якорь
	anchor->der = der;
	// декодировать тег
	t_count = derTDec(&anchor->tag, der, count);
	if (t_count == SIZE_MAX || anchor->tag != tag)
		return SIZE_MAX;
	// декодировать длину
	l_count = derLDec(&anchor->len, der + t_count, count - t_count);
	if (l_count == SIZE_MAX)
		return SIZE_MAX;
	return t_count + l_count;
}